

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

PyObject * EventVecToDict::convert(vector<EventDataType,_std::allocator<EventDataType>_> *vec)

{
  object_base *poVar1;
  proxy<boost::python::api::item_policies> *ppVar2;
  PyObject *pPVar3;
  vector<EventDataType,_std::allocator<EventDataType>_> *in_RDI;
  dict d;
  size_t i;
  list *l;
  EventDataType *in_stack_ffffffffffffff58;
  proxy<boost::python::api::item_policies> *this;
  dict *in_stack_ffffffffffffff78;
  list *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  proxy<boost::python::api::item_policies> *in_stack_ffffffffffffff90;
  object_operators<boost::python::api::object> *in_stack_ffffffffffffff98;
  string local_50 [40];
  proxy<boost::python::api::item_policies> *local_28;
  object_base *local_10;
  vector<EventDataType,_std::allocator<EventDataType>_> *local_8;
  
  local_8 = in_RDI;
  poVar1 = (object_base *)operator_new(8);
  boost::python::list::list((list *)0x39d829);
  local_28 = (proxy<boost::python::api::item_policies> *)0x0;
  local_10 = poVar1;
  while( true ) {
    this = local_28;
    ppVar2 = (proxy<boost::python::api::item_policies> *)
             std::vector<EventDataType,_std::allocator<EventDataType>_>::size(local_8);
    if (ppVar2 <= this) break;
    boost::python::dict::dict((dict *)0x39d879);
    std::vector<EventDataType,_std::allocator<EventDataType>_>::operator[]
              (local_8,(size_type)local_28);
    EventDataType::getName_abi_cxx11_(in_stack_ffffffffffffff58);
    boost::python::api::object_operators<boost::python::api::object>::operator[]<char[6]>
              (in_stack_ffffffffffffff98,(char (*) [6])in_stack_ffffffffffffff90);
    boost::python::api::proxy<boost::python::api::item_policies>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy(this);
    std::__cxx11::string::~string(local_50);
    std::vector<EventDataType,_std::allocator<EventDataType>_>::operator[]
              (local_8,(size_type)local_28);
    EventDataType::getOrigin_abi_cxx11_(in_stack_ffffffffffffff58);
    boost::python::api::object_operators<boost::python::api::object>::operator[]<char[7]>
              (in_stack_ffffffffffffff98,(char (*) [7])in_stack_ffffffffffffff90);
    boost::python::api::proxy<boost::python::api::item_policies>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy(this);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    boost::python::list::append<boost::python::dict>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    boost::python::dict::~dict((dict *)0x39d959);
    local_28 = (proxy<boost::python::api::item_policies> *)
               ((long)&(local_28->m_target).super_object_base.m_ptr + 1);
  }
  pPVar3 = boost::python::api::object_base::ptr(local_10);
  return pPVar3;
}

Assistant:

static PyObject* convert(const std::vector<EventDataType>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            dict d;
            d["event"] = vec[i].getName();
            d["origin"] = vec[i].getOrigin();
            l->append(d);
        }
        return l->ptr();
    }